

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_modern_uniform(CompilerHLSL *this,SPIRVariable *var)

{
  BaseType BVar1;
  bool bVar2;
  SPIRType *type;
  size_type sVar3;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_48;
  string local_40;
  
  type = Compiler::get<spirv_cross::SPIRType>
                   ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
  BVar1 = type->basetype;
  if (BVar1 - Image < 2) {
    local_48 = "";
    if ((BVar1 == Image) && ((type->image).sampled == 2)) {
      bVar2 = Compiler::has_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,Coherent);
      local_48 = "";
      if (bVar2) {
        local_48 = "globallycoherent ";
      }
    }
    image_type_hlsl_modern_abi_cxx11_(&local_a8,this,type,(var->super_IVariant).self.id);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&local_88,this,(ulong)(var->super_IVariant).self.id,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
              (&local_68,this,type,(ulong)(var->super_IVariant).self.id);
    to_resource_binding_abi_cxx11_(&local_40,this,var);
    CompilerGLSL::
    statement<char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,&local_48,&local_a8,(char (*) [2])0x3175f1,&local_88,
               &local_68,&local_40,(char (*) [2])0x344fd0);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_a8);
    if (type->basetype != SampledImage) {
      return;
    }
    if ((type->image).dim == Buffer) {
      return;
    }
    bVar2 = Compiler::is_depth_image((Compiler *)this,type,(var->super_IVariant).self.id);
    if (bVar2) {
      to_sampler_expression_abi_cxx11_(&local_a8,this,(var->super_IVariant).self.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (&local_88,this,type,(ulong)(var->super_IVariant).self.id);
      to_resource_binding_sampler_abi_cxx11_(&local_68,this,var);
      CompilerGLSL::
      statement<char_const(&)[24],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [24])"SamplerComparisonState ",&local_a8,
                 &local_88,&local_68,(char (*) [2])0x344fd0);
    }
    else {
      to_sampler_expression_abi_cxx11_(&local_a8,this,(var->super_IVariant).self.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (&local_88,this,type,(ulong)(var->super_IVariant).self.id);
      to_resource_binding_sampler_abi_cxx11_(&local_68,this,var);
      CompilerGLSL::
      statement<char_const(&)[14],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [14])"SamplerState ",&local_a8,&local_88,
                 &local_68,(char (*) [2])0x344fd0);
    }
  }
  else {
    if (BVar1 != Sampler) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x28])(&local_a8,this,var);
      to_resource_binding_abi_cxx11_(&local_88,this,var);
      CompilerGLSL::statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,&local_a8,&local_88,(char (*) [2])0x344fd0);
      goto LAB_001b7410;
    }
    local_a8._M_dataplus._M_p._0_4_ = (var->super_IVariant).self.id;
    sVar3 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.comparison_ids._M_h,
                    (key_type *)&local_a8);
    if (sVar3 == 0) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&local_a8,this,(ulong)(var->super_IVariant).self.id,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (&local_88,this,type,(ulong)(var->super_IVariant).self.id);
      to_resource_binding_abi_cxx11_(&local_68,this,var);
      CompilerGLSL::
      statement<char_const(&)[14],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [14])"SamplerState ",&local_a8,&local_88,
                 &local_68,(char (*) [2])0x344fd0);
    }
    else {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&local_a8,this,(ulong)(var->super_IVariant).self.id,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (&local_88,this,type,(ulong)(var->super_IVariant).self.id);
      to_resource_binding_abi_cxx11_(&local_68,this,var);
      CompilerGLSL::
      statement<char_const(&)[24],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [24])"SamplerComparisonState ",&local_a8,
                 &local_88,&local_68,(char (*) [2])0x344fd0);
    }
  }
  ::std::__cxx11::string::~string((string *)&local_68);
LAB_001b7410:
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

void CompilerHLSL::emit_modern_uniform(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	switch (type.basetype)
	{
	case SPIRType::SampledImage:
	case SPIRType::Image:
	{
		bool is_coherent = false;
		if (type.basetype == SPIRType::Image && type.image.sampled == 2)
			is_coherent = has_decoration(var.self, DecorationCoherent);

		statement(is_coherent ? "globallycoherent " : "", image_type_hlsl_modern(type, var.self), " ",
		          to_name(var.self), type_to_array_glsl(type, var.self), to_resource_binding(var), ";");

		if (type.basetype == SPIRType::SampledImage && type.image.dim != DimBuffer)
		{
			// For combined image samplers, also emit a combined image sampler.
			if (is_depth_image(type, var.self))
				statement("SamplerComparisonState ", to_sampler_expression(var.self), type_to_array_glsl(type, var.self),
				          to_resource_binding_sampler(var), ";");
			else
				statement("SamplerState ", to_sampler_expression(var.self), type_to_array_glsl(type, var.self),
				          to_resource_binding_sampler(var), ";");
		}
		break;
	}

	case SPIRType::Sampler:
		if (comparison_ids.count(var.self))
			statement("SamplerComparisonState ", to_name(var.self), type_to_array_glsl(type, var.self), to_resource_binding(var),
			          ";");
		else
			statement("SamplerState ", to_name(var.self), type_to_array_glsl(type, var.self), to_resource_binding(var), ";");
		break;

	default:
		statement(variable_decl(var), to_resource_binding(var), ";");
		break;
	}
}